

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparsityPatternLearner.h
# Opt level: O2

void __thiscall
chrono::ChSparsityPatternLearner::Apply(ChSparsityPatternLearner *this,ChSparseMatrix *mat)

{
  pointer plVar1;
  pointer plVar2;
  StorageIndex *pSVar3;
  int outer;
  long lVar4;
  long lVar5;
  pointer plVar6;
  pointer plVar7;
  
  if (this->processed == false) {
    process(this);
  }
  Eigen::SparseMatrix<double,_1,_int>::resize
            (mat,(this->super_SparseMatrix<double,_1,_int>).m_outerSize,
             (this->super_SparseMatrix<double,_1,_int>).m_innerSize);
  Eigen::SparseMatrix<double,1,int>::reserveInnerVectors<std::vector<int,std::allocator<int>>>
            ((SparseMatrix<double,1,int> *)mat,&this->innerVectors_size);
  plVar1 = (this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar2 = (this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = 0;
  for (lVar4 = 0; lVar4 != ((long)plVar2 - (long)plVar1) / 0x18; lVar4 = lVar4 + 1) {
    pSVar3 = (mat->m_data).m_indices;
    lVar5 = (long)(int)lVar5;
    plVar6 = plVar1 + lVar4;
    plVar7 = plVar6;
    while (plVar7 = *(pointer *)
                     &(plVar7->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node,
          plVar7 != plVar6) {
      pSVar3[lVar5] =
           *(StorageIndex *)
            ((long)&(plVar7->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node + 0x10);
      lVar5 = lVar5 + 1;
    }
  }
  return;
}

Assistant:

void Apply(ChSparseMatrix& mat) {
        if (!processed)
            process();

        // Resize the matrix and reserve space for non-zero elements in each inner vector
        mat.resize(rows(), cols());
        mat.reserve(innerVectors_size);

        int col_el = 0;
        for (auto outer = 0; outer < innerVectors.size(); ++outer) {
            for (auto inner = innerVectors[outer].begin(); inner != innerVectors[outer].end(); ++inner) {
                mat.innerIndexPtr()[col_el] = *inner;
                col_el++;
            }
        }
    }